

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::declareArray
          (HlslParseContext *this,TSourceLoc *loc,TString *identifier,TType *type,TSymbol **symbol,
          bool track)

{
  TSymbolTable *pTVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  TSymbol *pTVar3;
  undefined4 extraout_var_00;
  TVariable *this_01;
  TString *s;
  bool currentScope;
  bool local_31;
  TType *this_00;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  pTVar3 = *symbol;
  if (pTVar3 == (TSymbol *)0x0) {
    s = identifier;
    pTVar3 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,identifier,(bool *)0x0,
                                &local_31,(int *)0x0);
    *symbol = pTVar3;
    if ((pTVar3 == (TSymbol *)0x0) || (local_31 == false)) {
      this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)s);
      TVariable::TVariable(this_01,identifier,type,false);
      *symbol = (TSymbol *)this_01;
      TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_01);
      if (!track) {
        return;
      }
      pTVar1 = (this->super_TParseContextBase).symbolTable;
      if (4 < (int)((ulong)((long)(pTVar1->table).
                                  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->table).
                                 super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        return;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,*symbol);
      return;
    }
    iVar2 = (*pTVar3->_vptr_TSymbol[0xb])(pTVar3);
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot redeclare a user-block member array",
                 (identifier->_M_dataplus)._M_p,"");
      *symbol = (TSymbol *)0x0;
      return;
    }
    pTVar3 = *symbol;
    if (pTVar3 == (TSymbol *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"array variable name expected",(identifier->_M_dataplus)._M_p,"");
      return;
    }
  }
  iVar2 = (*pTVar3->_vptr_TSymbol[0xd])();
  this_00 = (TType *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*this_00->_vptr_TType[0x1e])(this_00);
  if ((char)iVar2 == '\0') {
    TType::updateArraySizes(this_00,type);
  }
  return;
}

Assistant:

void HlslParseContext::declareArray(const TSourceLoc& loc, const TString& identifier, const TType& type,
                                    TSymbol*& symbol, bool track)
{
    if (symbol == nullptr) {
        bool currentScope;
        symbol = symbolTable.find(identifier, nullptr, &currentScope);

        if (symbol && builtInName(identifier) && ! symbolTable.atBuiltInLevel()) {
            // bad shader (errors already reported) trying to redeclare a built-in name as an array
            return;
        }
        if (symbol == nullptr || ! currentScope) {
            //
            // Successfully process a new definition.
            // (Redeclarations have to take place at the same scope; otherwise they are hiding declarations)
            //
            symbol = new TVariable(&identifier, type);
            symbolTable.insert(*symbol);
            if (track && symbolTable.atGlobalLevel())
                trackLinkage(*symbol);

            return;
        }
        if (symbol->getAsAnonMember()) {
            error(loc, "cannot redeclare a user-block member array", identifier.c_str(), "");
            symbol = nullptr;
            return;
        }
    }

    //
    // Process a redeclaration.
    //

    if (symbol == nullptr) {
        error(loc, "array variable name expected", identifier.c_str(), "");
        return;
    }

    // redeclareBuiltinVariable() should have already done the copyUp()
    TType& existingType = symbol->getWritableType();

    if (existingType.isSizedArray()) {
        // be more lenient for input arrays to geometry shaders and tessellation control outputs,
        // where the redeclaration is the same size
        return;
    }

    existingType.updateArraySizes(type);
}